

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O2

float rsg::UnaryExponentialFunc<rsg::LogOp>::getCompWeight(float outMin,float outMax)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float inMax;
  float inMin;
  float local_c;
  float local_8;
  float local_4;
  
  fVar2 = 1.0;
  if ((-INFINITY < outMin) && (outMax < INFINITY)) {
    bVar1 = LogOp::transformValueRange(outMin,outMax,&local_8,&local_c);
    fVar2 = 0.0;
    if (bVar1) {
      bVar1 = quantizeFloatRange(&local_8,&local_c);
      fVar2 = 0.0;
      if (bVar1) {
        if ((outMin != outMax) || (NAN(outMin) || NAN(outMax))) {
          local_4 = logf(local_c);
          fVar2 = logf(local_8);
          fVar3 = (local_4 - fVar2) / (outMax - outMin);
          fVar2 = 0.1;
          if (0.1 <= fVar3) {
            fVar2 = fVar3;
          }
        }
        else {
          fVar2 = 1.0;
        }
      }
    }
  }
  return fVar2;
}

Assistant:

static inline float getCompWeight (float outMin, float outMax)
	{
		if (Scalar::min<float>() == outMin || Scalar::max<float>() == outMax)
			return 1.0f; // Infinite value range, anything goes

		// Transform range
		float inMin, inMax;
		if (!C::transformValueRange(outMin, outMax, inMin, inMax))
			return 0.0f; // Not possible to transform value range (out of range perhaps)

		// Quantize
		if (!quantizeFloatRange(inMin, inMax))
			return 0.0f; // Not possible to quantize - would cause accuracy issues

		if (outMin == outMax)
			return 1.0f; // Constant value and passed quantization

		// Evaluate new intersection
		float intersectionLen	= C::evaluateComp(inMax) - C::evaluateComp(inMin);
		float valRangeLen		= outMax - outMin;

		return deFloatMax(0.1f, intersectionLen/valRangeLen);
	}